

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O2

void pipeline_2P_SP(size_t L,uint w)

{
  promise<void> *this;
  Node *pNVar1;
  FlowBuilder FVar2;
  array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>
  *__cur;
  size_t *psVar3;
  long *plVar4;
  pointer p_Var5;
  size_type sVar6;
  int iVar7;
  long lVar8;
  size_t l;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  __allocator_type __a2;
  shared_ptr<tf::Topology> t;
  anon_class_40_5_4fb09de8 local_530;
  atomic<unsigned_long> j2;
  size_t j1;
  ulong local_4f8;
  size_type local_4f0;
  ulong local_4e8;
  size_t cnt;
  promise<void> promise;
  vector<int,_std::allocator<int>_> collection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  size_type local_478;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_470 [2];
  size_type local_460;
  ulong local_458;
  Node *local_450;
  vector<int,_std::allocator<int>_> source;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer;
  shared_ptr<tf::WorkerInterface> local_418;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
  local_408;
  undefined8 local_268;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<int,_std::allocator<int>_>::vector(&source,100,(allocator_type *)&local_408);
  iVar7 = 0;
  for (; source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         iVar7;
    iVar7 = iVar7 + 1;
  }
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            (&mybuffer,L,(allocator_type *)&local_408);
  local_4e8 = L << 4;
  local_460 = L + 1;
  local_458 = L >> 0x3b;
  local_4f8 = 0;
  local_4f0 = L;
  while( true ) {
    if (100 < local_4f8) {
      std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Vector_base
                (&mybuffer.
                  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&source.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    tf::Taskflow::Taskflow(&taskflow);
    j1 = 0;
    j2.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex.super___mutex_base._M_mutex._16_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex.super___mutex_base._M_mutex.__align = 0;
    mutex.super___mutex_base._M_mutex._8_8_ = 0;
    mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    collection.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cnt = 1;
    local_408._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._type = PARALLEL;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.N = local_4f8;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.collection = &collection;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.mutex = &mutex;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.j2 = &j2;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.mybuffer = &mybuffer;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._type = SERIAL;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._callable.N = local_4f8;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._callable.source = &source;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._callable.j1 = &j1;
    local_408._meta._M_elems[0].type = SERIAL;
    local_408._meta._M_elems[1].type = PARALLEL;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
    ._M_head_impl._callable.L = L;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._callable.mybuffer =
         local_408._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
         .
         super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>,_false>
         ._M_head_impl._callable.mybuffer;
    local_408._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
    ._M_head_impl._callable.L = L;
    if (local_458 != 0) break;
    local_408._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (L == 0) {
      local_408._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_408._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(local_4e8);
    }
    local_408._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(local_408._lines.
                           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                          super___atomic_base<unsigned_long>._M_i + local_4e8);
    local_408._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_408._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = L;
    while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
      (local_408._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_408._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_408._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_408._lines.
           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_408._tasks,local_460,(allocator_type *)&local_530);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_408._pipeflows,L,(allocator_type *)&local_530);
    std::
    queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&local_408._ready_tokens);
    local_408._token_dependencies._M_h._M_buckets =
         &local_408._token_dependencies._M_h._M_single_bucket;
    local_408._token_dependencies._M_h._M_bucket_count = 1;
    local_408._token_dependencies._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_408._token_dependencies._M_h._M_element_count = 0;
    local_408._token_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_408._token_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
    local_408._token_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_408._deferred_tokens._M_h._M_buckets = &local_408._deferred_tokens._M_h._M_single_bucket;
    local_408._deferred_tokens._M_h._M_bucket_count = 1;
    local_408._deferred_tokens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_408._deferred_tokens._M_h._M_element_count = 0;
    local_408._deferred_tokens._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_408._longest_deferral = 0;
    local_408._deferred_tokens._M_h._M_rehash_policy._M_next_resize = 0;
    local_408._deferred_tokens._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (L == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_408._pipes.
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_408._num_tokens = 0;
    lVar8 = 0x28;
    uVar9 = 0;
    while( true ) {
      if ((ulong)(((long)local_408._pipeflows.
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_408._pipeflows.
                        super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60) <= uVar9) break;
      *(undefined8 *)
       ((long)local_408._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar8 + -0x20) = 0;
      *(ulong *)((long)local_408._pipeflows.
                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8 + -0x28) = uVar9;
      *(undefined8 *)
       ((long)local_408._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar8 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&(local_408._pipeflows.
                          super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                          super__Vector_impl_data._M_start)->_line + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x60;
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_408._token_dependencies._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_408._deferred_tokens._M_h);
    (local_408._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar8 = 0x18;
    uVar9 = 1;
    while( true ) {
      if ((ulong)(((long)local_408._pipeflows.
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)local_408._pipeflows.
                        super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60) <= uVar9) break;
      *(long *)((long)&(local_408._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar8) =
           (long)(int)local_408._meta._M_elems[1].type;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    }
    (local_408._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1].join_counter.
    super___atomic_base<unsigned_long>._M_i = 1;
    lVar8 = 0x10;
    for (uVar9 = 1;
        uVar9 < (ulong)(((long)local_408._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_408._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar9 = uVar9 + 1)
    {
      *(long *)((long)&(local_408._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:320:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:333:7)>_>::Line,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar8) =
           (long)(int)local_408._meta._M_elems[0].type + -1;
      lVar8 = lVar8 + 0x10;
    }
    local_530.j1 = (size_t *)operator_new(0xd8);
    *local_530.j1 = 0;
    local_530.j1[1] = (size_t)(local_530.j1 + 3);
    local_530.j1[2] = 0;
    *(undefined1 *)(local_530.j1 + 3) = 0;
    local_530.j1[5] = 0;
    local_530.j1[6] = 0;
    local_530.j1[7] = 0;
    local_530.j1[8] = 0;
    local_530.j1[9] = (size_t)(local_530.j1 + 0xc);
    local_530.j1[10] = (size_t)(local_530.j1 + 0xc);
    local_530.j1[0xb] = (size_t)(local_530.j1 + 0x10);
    local_530.j1[0x10] = 0;
    local_530.j1[0x12] = 0;
    local_530.j1[0x11] = (size_t)&local_408;
    local_530.j1[0x14] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_invoke;
    local_530.j1[0x13] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_manager;
    *(undefined1 *)(local_530.j1 + 0x18) = 4;
    local_530.j1[0x19] = 0;
    local_530.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_408,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    pNVar1 = local_408._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"cond",(allocator<char> *)&local_498);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    (local_408._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar1;
    std::__cxx11::string::~string((string *)&local_530);
    for (uVar9 = 0; FVar2._graph = taskflow.super_FlowBuilder._graph,
        uVar9 < (ulong)(((long)local_408._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_408._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar9 = uVar9 + 1)
    {
      local_530.j1 = (size_t *)operator_new(0xd8);
      *local_530.j1 = 0;
      local_530.j1[1] = (size_t)(local_530.j1 + 3);
      local_530.j1[2] = 0;
      *(undefined1 *)(local_530.j1 + 3) = 0;
      local_530.j1[5] = 0;
      local_530.j1[6] = 0;
      local_530.j1[7] = 0;
      local_530.j1[8] = 0;
      local_530.j1[9] = (size_t)(local_530.j1 + 0xc);
      local_530.j1[10] = (size_t)(local_530.j1 + 0xc);
      local_530.j1[0xb] = (size_t)(local_530.j1 + 0x10);
      local_530.j1[0x10] = 0;
      local_530.j1[0x11] = (size_t)&local_408;
      local_530.j1[0x12] = uVar9;
      local_530.j1[0x14] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_invoke;
      local_530.j1[0x13] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_manager;
      *(undefined1 *)(local_530.j1 + 0x18) = 2;
      local_530.j1[0x19] = 0;
      local_530.j1[0x1a] = 0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_408,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
      pNVar1 = local_408._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_(&local_498,"rt-",3);
      std::__cxx11::to_string((string *)&promise,uVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_530
                     ,&local_498,(string *)&promise);
      std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
      local_408._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9 + 1]._node = pNVar1;
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&promise);
      std::__cxx11::string::~string((string *)&local_498);
      tf::Task::precede<tf::Task&>
                (local_408._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_408._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9 + 1);
    }
    local_530.j1 = (size_t *)operator_new(0xd8);
    *local_530.j1 = 0;
    local_530.j1[1] = (size_t)(local_530.j1 + 3);
    local_530.j1[2] = 0;
    *(undefined1 *)(local_530.j1 + 3) = 0;
    local_530.j1[5] = 0;
    local_530.j1[6] = 0;
    local_530.j1[7] = 0;
    local_530.j1[8] = 0;
    local_530.j1[9] = (size_t)(local_530.j1 + 0xc);
    local_530.j1[10] = (size_t)(local_530.j1 + 0xc);
    local_530.j1[0xb] = (size_t)(local_530.j1 + 0x10);
    local_530.j1[0x10] = 0;
    local_530.j1[0x11] = (size_t)&local_408;
    *(undefined1 *)(local_530.j1 + 0x18) = 6;
    local_530.j1[0x19] = 0;
    local_530.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"module_of_pipeline",(allocator<char> *)&local_498);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    local_450 = pNVar1;
    std::__cxx11::string::~string((string *)&local_530);
    FVar2 = taskflow.super_FlowBuilder;
    psVar3 = (size_t *)operator_new(0xd8);
    *psVar3 = 0;
    psVar3[1] = (size_t)(psVar3 + 3);
    psVar3[2] = 0;
    *(undefined1 *)(psVar3 + 3) = 0;
    psVar3[5] = 0;
    psVar3[6] = 0;
    psVar3[7] = 0;
    psVar3[8] = 0;
    psVar3[9] = (size_t)(psVar3 + 0xc);
    psVar3[10] = (size_t)(psVar3 + 0xc);
    psVar3[0xb] = (size_t)(psVar3 + 0x10);
    psVar3[0x10] = 0;
    psVar3[0x11] = 0;
    psVar3[0x12] = 0;
    psVar3[0x13] = 0;
    psVar3[0x14] = 0;
    plVar4 = (long *)operator_new(0x30);
    *plVar4 = (long)&j1;
    plVar4[1] = (long)&local_4f8;
    plVar4[2] = (long)&j2;
    plVar4[3] = (long)&collection;
    plVar4[4] = (long)&local_408;
    plVar4[5] = (long)&cnt;
    psVar3[0x11] = (size_t)plVar4;
    psVar3[0x14] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:344:34)>
                           ::_M_invoke;
    psVar3[0x13] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:344:34)>
                           ::_M_manager;
    *(undefined1 *)(psVar3 + 0x18) = 1;
    psVar3[0x19] = 0;
    psVar3[0x1a] = 0;
    local_530.j1 = psVar3;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_530);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"test",(allocator<char> *)&local_498);
    L = local_4f0;
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    std::__cxx11::string::~string((string *)&local_530);
    tf::Node::_precede(local_450,pNVar1);
    local_530.j1 = &j1;
    local_530.j2 = &j2;
    local_530.collection = &collection;
    local_530.mybuffer = &mybuffer;
    local_530.cnt = &cnt;
    tf::Executor::_increment_topology(&executor);
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pipeline_2P_SP::anon_class_40_5_4fb09de8::operator()(&local_530);
      std::promise<void>::promise(&promise);
      std::promise<void>::set_value(&promise);
      tf::Executor::_decrement_topology(&executor);
      std::__basic_future<void>::__basic_future((__basic_future<void> *)&t,(__state_type *)&promise)
      ;
      local_498._M_dataplus._M_p =
           (pointer)t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_498._M_string_length =
           (size_type)
           t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_498.field_2._M_allocated_capacity = 0;
      local_498.field_2._8_8_ = 0;
      local_268 = 0;
      _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_260);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::promise<void>::~promise(&promise);
    }
    else {
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var5 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00177cf8;
      (p_Var5->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&taskflow;
      this = (promise<void> *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::promise<void>::promise(this);
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = 2;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x48) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x58) = 0;
      plVar4 = (long *)operator_new(0x28);
      plVar4[4] = (long)local_530.cnt;
      plVar4[2] = (long)local_530.collection;
      plVar4[3] = (long)local_530.mybuffer;
      *plVar4 = (long)local_530.j1;
      plVar4[1] = (long)local_530.j2;
      *(long **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = plVar4;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x58) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:357:33)>
           ::_M_invoke;
      *(code **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x50) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:357:33)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x60) = 0;
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x70) = 0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var5->_M_impl;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&promise);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&promise,(__state_type *)this);
      std::__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<tf::Topology,void>
                ((__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2> *)&local_478,
                 &t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      local_498._M_dataplus._M_p =
           (pointer)promise._M_future.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_498._M_string_length =
           (size_type)
           promise._M_future.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_498.field_2._M_allocated_capacity = local_478;
      local_498.field_2._8_8_ = a_Stack_470[0]._M_pi;
      local_478 = 0;
      a_Stack_470[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_470);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&promise._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::mutex::lock(&taskflow._mutex);
      L = local_4f0;
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back(&taskflow._topologies.c,
                (value_type *)&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      sVar6 = std::
              deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
              ::size(&taskflow._topologies.c);
      if (sVar6 == 1) {
        tf::Executor::_set_up_topology
                  (&executor,*(Worker **)(in_FS_OFFSET + -8),
                   t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&taskflow._mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::future<void>::get((future<void> *)&local_498);
    tf::Future<void>::~Future((Future<void> *)&local_498);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:320:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:333:7)>_>
    ::~Pipeline(&local_408);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection.super__Vector_base<int,_std::allocator<int>_>);
    tf::Taskflow::~Taskflow(&taskflow);
    local_4f8 = local_4f8 + 1;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void pipeline_2P_SP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 2>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::Pipeline pl(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1, &mybuffer, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        j1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection, &mutex, &j2, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex);
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline = taskflow.composed_of(pl).name("module_of_pipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);

      std::sort(collection.begin(), collection.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    pipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = 0;
      collection.clear();
      for(size_t i = 0; i < mybuffer.size(); ++i){
        for(size_t j = 0; j < mybuffer[0].size(); ++j){
          mybuffer[i][j] = 0;
        }
      }
      cnt++;
    }).get();
  }
}